

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

Var JSON::Stringify(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  Var aValue;
  bool bVar2;
  int iVar3;
  CallFlags e;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Type *this_00;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar7;
  undefined4 extraout_var;
  DynamicObject *local_138;
  Var local_128;
  LazyJSONString *lazy;
  CallInfo local_d8;
  Var result;
  DynamicObject *remoteObject;
  Var space;
  Var replacerArg;
  Var value;
  RecyclableObject *local_a0;
  undefined1 local_98 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = Js::RecyclableObject::GetScriptContext(function);
  this = Js::ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = Js::RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = Js::CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                       ,0x69,"(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                       "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  Js::ArgumentReader::ArgumentReader((ArgumentReader *)&library,(CallInfo *)&function_local,values);
  this_00 = Js::RecyclableObject::GetType(function);
  this_01 = Js::Type::GetLibrary(this_00);
  __tag.entry.next = (Entry *)Js::JavascriptLibrary::GetScriptContext(this_01);
  local_a0 = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_98,function,(CallInfo)function_local,
             L"JSON.stringify",&stack0x00000000);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar2 = Js::operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                       ,0x6e,"(!(callInfo.Flags & Js::CallFlags_New))",
                       "!(callInfo.Flags & Js::CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((uint)library & 0xffffff) < 2) {
    callInfo_local =
         (CallInfo)Js::JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    replacerArg = Js::Arguments::operator[]((Arguments *)&library,1);
    if (((uint)library & 0xffffff) < 3) {
      local_128 = (Var)0x0;
    }
    else {
      local_128 = Js::Arguments::operator[]((Arguments *)&library,2);
    }
    space = local_128;
    if (((uint)library & 0xffffff) < 4) {
      local_138 = (DynamicObject *)
                  Js::JavascriptLibraryBase::GetNull(&this_01->super_JavascriptLibraryBase);
    }
    else {
      local_138 = (DynamicObject *)Js::Arguments::operator[]((Arguments *)&library,3);
    }
    aValue = replacerArg;
    remoteObject = local_138;
    if (replacerArg == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = Js::TaggedInt::Is(aValue);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(aValue);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRVar7 = Js::UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_18 = Js::RecyclableObject::GetTypeId(pRVar7);
        if ((0x57 < (int)local_18) && (BVar4 = Js::RecyclableObject::IsExternal(pRVar7), BVar4 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    if (local_18 == TypeIds_HostDispatch) {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(replacerArg);
      iVar3 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x56])();
      result = (Var)CONCAT44(extraout_var,iVar3);
      if ((DynamicObject *)result == (DynamicObject *)0x0) {
        pRVar7 = Js::VarTo<Js::RecyclableObject>(replacerArg);
        Js::Arguments::Arguments((Arguments *)&lazy,(Arguments *)&library);
        iVar3 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar7,Stringify,&lazy,&local_d8);
        if (iVar3 != 0) {
          callInfo_local = local_d8;
          goto LAB_010b07a8;
        }
      }
      else {
        bVar2 = Js::VarIsCorrectType<Js::DynamicObject>((DynamicObject *)result);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                             ,0x80,"(Js::VarIsCorrectType(remoteObject))",
                             "Js::VarIsCorrectType(remoteObject)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        replacerArg = result;
      }
    }
    callInfo_local =
         (CallInfo)
         Js::JSONStringifier::Stringify
                   ((ScriptContext *)__tag.entry.next,replacerArg,space,remoteObject);
    if (callInfo_local == (CallInfo)0x0) {
      callInfo_local =
           (CallInfo)Js::JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
    }
  }
LAB_010b07a8:
  value._0_4_ = 1;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_98);
  return (Var)callInfo_local;
}

Assistant:

Js::Var Stringify(Js::RecyclableObject* function, Js::CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        //ES5: Stringify(value, [replacer][, space]])
        ARGUMENTS(args, callInfo);
        Js::JavascriptLibrary* library = function->GetType()->GetLibrary();
        Js::ScriptContext* scriptContext = library->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("JSON.stringify"));

        Assert(!(callInfo.Flags & Js::CallFlags_New));

        if (args.Info.Count < 2)
        {
            // if value is missing it is assumed to be 'undefined'.
            // shortcut: the stringify algorithm returns undefined in this case.
            return library->GetUndefined();
        }
        Js::Var value = args[1];
        Js::Var replacerArg = args.Info.Count > 2 ? args[2] : nullptr;
        Js::Var space = args.Info.Count > 3 ? args[3] : library->GetNull();

        if (Js::JavascriptOperators::GetTypeId(value) == Js::TypeIds_HostDispatch)
        {
            // If we a remote object, we need to pull out the underlying JS object to stringify that
            Js::DynamicObject* remoteObject = Js::VarTo<Js::RecyclableObject>(value)->GetRemoteObject();
            if (remoteObject != nullptr)
            {
                AssertOrFailFast(Js::VarIsCorrectType(remoteObject));
                value = remoteObject;
            }
            else
            {
                Js::Var result;
                if (Js::VarTo<Js::RecyclableObject>(value)->InvokeBuiltInOperationRemotely(Stringify, args, &result))
                {
                    return result;
                }
            }
        }

        LazyJSONString* lazy = JSONStringifier::Stringify(scriptContext, value, replacerArg, space);
        if (!lazy)
        {
            return library->GetUndefined();
        }
        return lazy;
    }